

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<LiteralExpressionAstNode>_> * __thiscall
Parser::parseLiteralExpression
          (optional<std::shared_ptr<LiteralExpressionAstNode>_> *__return_storage_ptr__,Parser *this
          )

{
  uint uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_50 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  shared_ptr<Token> token;
  
  TokenBuffer::currentToken((TokenBuffer *)&local_30);
  uVar1 = *(uint *)&local_30._M_pi[2]._vptr__Sp_counted_base;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&token);
  if ((uVar1 < 0x1c) && ((0xe300000U >> (uVar1 & 0x1f) & 1) != 0)) {
    TokenBuffer::currentToken((TokenBuffer *)&local_30);
    TokenBuffer::nextToken((TokenBuffer *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    std::make_shared<LiteralExpressionAstNode,std::shared_ptr<Token>&>
              ((shared_ptr<Token> *)(local_50 + 0x10));
    _Var2._M_pi = local_38._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<LiteralExpressionAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<LiteralExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>._M_payload._M_value.
    super___shared_ptr<LiteralExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_50._16_8_;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<LiteralExpressionAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<LiteralExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>._M_payload._M_value.
    super___shared_ptr<LiteralExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    local_50._16_8_ = 0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<LiteralExpressionAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<LiteralExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>._M_engaged = true;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&token);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<LiteralExpressionAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<LiteralExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<LiteralExpressionAstNode>>
Parser::parseLiteralExpression() noexcept {

  switch (this->tokenBuffer->currentToken()->tokenType)  {
    case TokenType::BooleanLiteral:
    case TokenType::StringLiteral:
    case TokenType::IntegerLiteral:
    case TokenType::FloatLiteral:
    case TokenType::UndefinedLiteral:
      break;
    default:
      return std::nullopt;
  }

  auto token = this->tokenBuffer->currentToken();
  this->tokenBuffer->nextToken();
  return std::make_shared<LiteralExpressionAstNode>(token);
}